

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sumhashgenerator.cpp
# Opt level: O0

char * __thiscall SumHashGenerator::hash(SumHashGenerator *this,char *src)

{
  int iVar1;
  size_t sVar2;
  char *__s;
  char *res;
  int i;
  int sum;
  int sumlen;
  int len;
  char *src_local;
  SumHashGenerator *this_local;
  
  sVar2 = strlen(src);
  for (res._0_4_ = 0; (int)res < (int)sVar2; res._0_4_ = (int)res + 1) {
    res._4_4_ = (int)src[(int)res] + res._4_4_;
  }
  iVar1 = getNumberLength(res._4_4_);
  __s = (char *)operator_new__((long)(iVar1 + 1));
  memset(__s,0,(long)(iVar1 + 1));
  sprintf(__s,"%d",(ulong)res._4_4_);
  return __s;
}

Assistant:

char* SumHashGenerator::hash(const char* src)
{
	int len = strlen(src);
	int sumlen = 0;
	int sum;

	for (int i = 0; i < len; ++i) {
		sum += (int)src[i];
	}

	sumlen = getNumberLength(sum);
	char* res = new char[sumlen + 1];
	memset(res, 0x00, sumlen + 1);

	sprintf(res, "%d", sum);

	return res;
}